

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseFrameSet(TidyDocImpl *doc,Node *frameset,GetTokenMode mode)

{
  Lexer *pLVar1;
  Dict *pDVar2;
  Node *pNVar3;
  Bool BVar4;
  Node *node;
  Node **ppNVar5;
  
  if ((doc->config).value[1].v == 0) {
    *(byte *)&doc->badAccess = (byte)doc->badAccess | 0x10;
  }
  pLVar1 = doc->lexer;
LAB_00140e34:
  do {
    while( true ) {
      do {
        node = prvTidyGetToken(doc,IgnoreWhitespace);
        if (node == (Node *)0x0) {
          prvTidyReport(doc,frameset,(Node *)0x0,0x25a);
          return;
        }
        if ((node->tag == frameset->tag) && (node->type == EndTag)) {
          prvTidyFreeNode(doc,node);
          frameset->closed = yes;
          TrimSpaces(doc,frameset);
          return;
        }
        BVar4 = InsertMisc(frameset,node);
      } while (BVar4 != no);
      if (node->tag != (Dict *)0x0) break;
LAB_00140f69:
      prvTidyReport(doc,frameset,node,0x235);
      prvTidyFreeNode(doc,node);
    }
    BVar4 = prvTidynodeIsElement(node);
    pDVar2 = node->tag;
    if (BVar4 == no) {
      if (pDVar2 != (Dict *)0x0) goto LAB_00140eac;
    }
    else if (pDVar2 != (Dict *)0x0) {
      if ((pDVar2->model & 4) != 0) {
        MoveToHead(doc,frameset,node);
        goto LAB_00140e34;
      }
LAB_00140eac:
      if (pDVar2->id == TidyTag_BODY) {
        prvTidyUngetToken(doc);
        node = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
        prvTidyReport(doc,frameset,node,0x247);
      }
    }
    pDVar2 = node->tag;
    if (node->type != StartEndTag) {
      if (node->type == StartTag) {
        if ((pDVar2->model & 0x2000) != 0) {
          node->parent = frameset;
          pNVar3 = frameset->last;
          node->prev = pNVar3;
          ppNVar5 = &pNVar3->next;
          if (pNVar3 == (Node *)0x0) {
            ppNVar5 = &frameset->content;
          }
          *ppNVar5 = node;
          frameset->last = node;
          pLVar1->excludeBlocks = no;
          ParseTag(doc,node,MixedContent);
          goto LAB_00140e34;
        }
      }
      else if (pDVar2 == (Dict *)0x0) goto LAB_00140f69;
LAB_00140f5c:
      if (pDVar2->id == TidyTag_A) {
        *(byte *)&doc->badAccess = (byte)doc->badAccess | 0x40;
      }
      goto LAB_00140f69;
    }
    if ((pDVar2->model & 0x2000) == 0) goto LAB_00140f5c;
    node->parent = frameset;
    pNVar3 = frameset->last;
    node->prev = pNVar3;
    ppNVar5 = &pNVar3->next;
    if (pNVar3 == (Node *)0x0) {
      ppNVar5 = &frameset->content;
    }
    *ppNVar5 = node;
    frameset->last = node;
  } while( true );
}

Assistant:

void TY_(ParseFrameSet)(TidyDocImpl* doc, Node *frameset, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node;

    if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
    {
        doc->badAccess |= BA_USING_FRAMES;
    }
    
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == frameset->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            frameset->closed = yes;
            TrimSpaces(doc, frameset);
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(frameset, node))
            continue;

        if (node->tag == NULL)
        {
            TY_(Report)(doc, frameset, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue; 
        }

        if (TY_(nodeIsElement)(node))
        {
            if (node->tag && node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, frameset, node);
                continue;
            }
        }

        if ( nodeIsBODY(node) )
        {
            TY_(UngetToken)( doc );
            node = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
            TY_(Report)(doc, frameset, node, INSERTING_TAG);
        }

        if (node->type == StartTag && (node->tag->model & CM_FRAMES))
        {
            TY_(InsertNodeAtEnd)(frameset, node);
            lexer->excludeBlocks = no;
            ParseTag(doc, node, MixedContent);
            continue;
        }
        else if (node->type == StartEndTag && (node->tag->model & CM_FRAMES))
        {
            TY_(InsertNodeAtEnd)(frameset, node);
            continue;
        }

        /* discard unexpected tags */
        /* WAI [6.5.1.4] link is being discarded outside of NOFRAME */
        if ( nodeIsA(node) )
           doc->badAccess |= BA_INVALID_LINK_NOFRAMES;

        TY_(Report)(doc, frameset, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, frameset, node, MISSING_ENDTAG_FOR);
}